

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O1

void cgltf_free(cgltf_data *data)

{
  void *pvVar1;
  cgltf_morph_target *pcVar2;
  cgltf_morph_target *pcVar3;
  cgltf_primitive *pcVar4;
  cgltf_mesh *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (data == (cgltf_data *)0x0) {
    return;
  }
  (*data->memory_free)(data->memory_user_data,(data->asset).copyright);
  (*data->memory_free)(data->memory_user_data,(data->asset).generator);
  (*data->memory_free)(data->memory_user_data,(data->asset).version);
  (*data->memory_free)(data->memory_user_data,(data->asset).min_version);
  (*data->memory_free)(data->memory_user_data,data->accessors);
  (*data->memory_free)(data->memory_user_data,data->buffer_views);
  if (data->buffers_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pvVar1 = *(void **)((long)&data->buffers->data + lVar8);
      if (pvVar1 != data->bin) {
        (*data->memory_free)(data->memory_user_data,pvVar1);
      }
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->buffers->uri + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar9 < data->buffers_count);
  }
  (*data->memory_free)(data->memory_user_data,data->buffers);
  if (data->meshes_count != 0) {
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,data->meshes[uVar9].name);
      pcVar5 = data->meshes;
      if (pcVar5[uVar9].primitives_count != 0) {
        uVar6 = 0;
        do {
          pcVar4 = data->meshes[uVar9].primitives;
          if (pcVar4[uVar6].attributes_count != 0) {
            lVar8 = 0;
            uVar10 = 0;
            do {
              (*data->memory_free)
                        (data->memory_user_data,
                         *(void **)((long)&(pcVar4[uVar6].attributes)->name + lVar8));
              uVar10 = uVar10 + 1;
              pcVar4 = data->meshes[uVar9].primitives;
              lVar8 = lVar8 + 0x18;
            } while (uVar10 < pcVar4[uVar6].attributes_count);
          }
          (*data->memory_free)(data->memory_user_data,pcVar4[uVar6].attributes);
          pcVar4 = data->meshes[uVar9].primitives;
          if (pcVar4[uVar6].targets_count != 0) {
            uVar10 = 0;
            do {
              pcVar2 = data->meshes[uVar9].primitives[uVar6].targets;
              pcVar3 = pcVar2 + uVar10;
              if (pcVar2[uVar10].attributes_count != 0) {
                lVar8 = 0;
                uVar7 = 0;
                do {
                  (*data->memory_free)
                            (data->memory_user_data,
                             *(void **)((long)&pcVar3->attributes->name + lVar8));
                  uVar7 = uVar7 + 1;
                  pcVar2 = data->meshes[uVar9].primitives[uVar6].targets;
                  pcVar3 = pcVar2 + uVar10;
                  lVar8 = lVar8 + 0x18;
                } while (uVar7 < pcVar2[uVar10].attributes_count);
              }
              (*data->memory_free)(data->memory_user_data,pcVar3->attributes);
              uVar10 = uVar10 + 1;
              pcVar4 = data->meshes[uVar9].primitives;
            } while (uVar10 < pcVar4[uVar6].targets_count);
          }
          (*data->memory_free)(data->memory_user_data,pcVar4[uVar6].targets);
          uVar6 = uVar6 + 1;
          pcVar5 = data->meshes;
        } while (uVar6 < pcVar5[uVar9].primitives_count);
      }
      (*data->memory_free)(data->memory_user_data,pcVar5[uVar9].primitives);
      (*data->memory_free)(data->memory_user_data,data->meshes[uVar9].weights);
      pcVar5 = data->meshes;
      if (pcVar5[uVar9].target_names_count != 0) {
        uVar6 = 0;
        do {
          (*data->memory_free)(data->memory_user_data,pcVar5[uVar9].target_names[uVar6]);
          uVar6 = uVar6 + 1;
          pcVar5 = data->meshes;
        } while (uVar6 < pcVar5[uVar9].target_names_count);
      }
      (*data->memory_free)(data->memory_user_data,pcVar5[uVar9].target_names);
      uVar9 = uVar9 + 1;
    } while (uVar9 < data->meshes_count);
  }
  (*data->memory_free)(data->memory_user_data,data->meshes);
  if (data->materials_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)
                (data->memory_user_data,
                 *(void **)((long)(data->materials->pbr_metallic_roughness).base_color_texture.
                                  transform.offset + lVar8 + -0x24));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x248;
    } while (uVar9 < data->materials_count);
  }
  (*data->memory_free)(data->memory_user_data,data->materials);
  if (data->images_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->images->name + lVar8));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->images->uri + lVar8));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->images->mime_type + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x30;
    } while (uVar9 < data->images_count);
  }
  (*data->memory_free)(data->memory_user_data,data->images);
  if (data->textures_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->textures->name + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar9 < data->textures_count);
  }
  (*data->memory_free)(data->memory_user_data,data->textures);
  (*data->memory_free)(data->memory_user_data,data->samplers);
  if (data->skins_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->skins->name + lVar8));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->skins->joints + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x38;
    } while (uVar9 < data->skins_count);
  }
  (*data->memory_free)(data->memory_user_data,data->skins);
  if (data->cameras_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->cameras->name + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x40;
    } while (uVar9 < data->cameras_count);
  }
  (*data->memory_free)(data->memory_user_data,data->cameras);
  if (data->lights_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->lights->color + lVar8 + -8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar9 < data->lights_count);
  }
  (*data->memory_free)(data->memory_user_data,data->lights);
  if (data->nodes_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar8 + -0x60));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar8 + -0x50));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar8 + -0x20));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0xd8;
    } while (uVar9 < data->nodes_count);
  }
  (*data->memory_free)(data->memory_user_data,data->nodes);
  if (data->scenes_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->scenes->name + lVar8));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->scenes->nodes + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar9 < data->scenes_count);
  }
  (*data->memory_free)(data->memory_user_data,data->scenes);
  if (data->animations_count != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->animations->name + lVar8))
      ;
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->animations->samplers + lVar8));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->animations->channels + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x38;
    } while (uVar9 < data->animations_count);
  }
  (*data->memory_free)(data->memory_user_data,data->animations);
  if (data->extensions_used_count != 0) {
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,data->extensions_used[uVar9]);
      uVar9 = uVar9 + 1;
    } while (uVar9 < data->extensions_used_count);
  }
  (*data->memory_free)(data->memory_user_data,data->extensions_used);
  if (data->extensions_required_count != 0) {
    uVar9 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,data->extensions_required[uVar9]);
      uVar9 = uVar9 + 1;
    } while (uVar9 < data->extensions_required_count);
  }
  (*data->memory_free)(data->memory_user_data,data->extensions_required);
  (*data->memory_free)(data->memory_user_data,data->file_data);
  (*data->memory_free)(data->memory_user_data,data);
  return;
}

Assistant:

void cgltf_free(cgltf_data* data)
{
    if (!data)
    {
        return;
    }

    data->memory_free(data->memory_user_data, data->asset.copyright);
    data->memory_free(data->memory_user_data, data->asset.generator);
    data->memory_free(data->memory_user_data, data->asset.version);
    data->memory_free(data->memory_user_data, data->asset.min_version);

    data->memory_free(data->memory_user_data, data->accessors);
    data->memory_free(data->memory_user_data, data->buffer_views);

    for (cgltf_size i = 0; i < data->buffers_count; ++i)
    {
        if (data->buffers[i].data != data->bin)
        {
            data->memory_free(data->memory_user_data, data->buffers[i].data);
        }

        data->memory_free(data->memory_user_data, data->buffers[i].uri);
    }

    data->memory_free(data->memory_user_data, data->buffers);

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->meshes[i].name);

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
            {
                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes[k].name);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes);

            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
            {
                for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                {
                    data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes[m].name);
                }

                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].primitives);
        data->memory_free(data->memory_user_data, data->meshes[i].weights);

        for (cgltf_size j = 0; j < data->meshes[i].target_names_count; ++j)
        {
            data->memory_free(data->memory_user_data, data->meshes[i].target_names[j]);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].target_names);
    }

    data->memory_free(data->memory_user_data, data->meshes);

    for (cgltf_size i = 0; i < data->materials_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->materials[i].name);
    }

    data->memory_free(data->memory_user_data, data->materials);

    for (cgltf_size i = 0; i < data->images_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->images[i].name);
        data->memory_free(data->memory_user_data, data->images[i].uri);
        data->memory_free(data->memory_user_data, data->images[i].mime_type);
    }

    data->memory_free(data->memory_user_data, data->images);

    for (cgltf_size i = 0; i < data->textures_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->textures[i].name);
    }

    data->memory_free(data->memory_user_data, data->textures);

    data->memory_free(data->memory_user_data, data->samplers);

    for (cgltf_size i = 0; i < data->skins_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->skins[i].name);
        data->memory_free(data->memory_user_data, data->skins[i].joints);
    }

    data->memory_free(data->memory_user_data, data->skins);

    for (cgltf_size i = 0; i < data->cameras_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->cameras[i].name);
    }

    data->memory_free(data->memory_user_data, data->cameras);

    for (cgltf_size i = 0; i < data->lights_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->lights[i].name);
    }

    data->memory_free(data->memory_user_data, data->lights);

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->nodes[i].name);
        data->memory_free(data->memory_user_data, data->nodes[i].children);
        data->memory_free(data->memory_user_data, data->nodes[i].weights);
    }

    data->memory_free(data->memory_user_data, data->nodes);

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->scenes[i].name);
        data->memory_free(data->memory_user_data, data->scenes[i].nodes);
    }

    data->memory_free(data->memory_user_data, data->scenes);

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->animations[i].name);
        data->memory_free(data->memory_user_data, data->animations[i].samplers);
        data->memory_free(data->memory_user_data, data->animations[i].channels);
    }

    data->memory_free(data->memory_user_data, data->animations);

    for (cgltf_size i = 0; i < data->extensions_used_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_used[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_used);

    for (cgltf_size i = 0; i < data->extensions_required_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_required[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_required);

    data->memory_free(data->memory_user_data, data->file_data);

    data->memory_free(data->memory_user_data, data);
}